

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  long lVar1;
  Allocator *pAVar2;
  pointer pBVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  Mat *pMVar7;
  ulong uVar8;
  reference pvVar9;
  NetPrivate *pNVar10;
  reference ppLVar11;
  long *in_RSI;
  long *in_RDI;
  int lr_1;
  Layer *layer_cpu;
  Option opt1;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_3;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  int layer_support_vulkan;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  char *in_stack_fffffffffffff3f8;
  ParamDict *in_stack_fffffffffffff400;
  Mat *in_stack_fffffffffffff410;
  NetPrivate *in_stack_fffffffffffff418;
  NetPrivate *in_stack_fffffffffffff420;
  NetPrivate *in_stack_fffffffffffff430;
  NetPrivate *in_stack_fffffffffffff438;
  NetPrivate *in_stack_fffffffffffff440;
  NetPrivate *in_stack_fffffffffffff450;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff498;
  Mat *in_stack_fffffffffffff4a0;
  Net *in_stack_fffffffffffff4b0;
  NetPrivate *local_a38;
  byte local_a11;
  int local_9e8;
  int local_9e4;
  undefined1 local_9e0 [8];
  int *local_9d8;
  Allocator *local_9d0;
  undefined4 local_9c8;
  long *local_9c0;
  undefined4 local_9b8;
  int local_9b4;
  int local_9b0;
  undefined4 local_9ac;
  int local_9a8;
  ulong local_9a0;
  NetPrivate *local_998;
  int *local_990;
  undefined8 local_988;
  undefined4 local_980;
  long *local_978;
  undefined4 local_970;
  int local_96c;
  int local_968;
  undefined4 local_964;
  undefined4 local_960;
  long local_958;
  void *local_950;
  int *local_948;
  undefined8 local_940;
  undefined4 local_938;
  long *local_930;
  undefined4 local_928;
  int local_924;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  long local_910;
  int local_904;
  reference local_900;
  int local_8f4;
  int *local_8f0;
  void *local_8e8;
  DataReader *in_stack_fffffffffffff720;
  int *piVar12;
  ParamDict *in_stack_fffffffffffff728;
  Mat local_8a0;
  int local_854;
  uint local_850;
  allocator<char> local_849;
  string local_848 [32];
  undefined1 local_828 [256];
  reference local_728;
  int local_71c;
  reference local_718;
  allocator<char> local_709;
  string local_708 [32];
  reference local_6e8;
  int local_6dc;
  undefined1 local_6d8 [256];
  int local_5d8;
  allocator<char> local_5d1;
  string local_5d0 [39];
  allocator<char> local_5a9;
  string local_5a8 [32];
  NetPrivate *local_588;
  int local_580;
  int local_570;
  int local_56c;
  undefined1 local_568 [256];
  undefined1 local_468 [264];
  uint local_360;
  int local_35c;
  ParamDict local_358;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_324;
  void **local_320;
  int local_318;
  undefined4 local_314;
  Mat *local_310;
  NetPrivate *local_308;
  NetPrivate *local_300;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  reference local_2e8;
  reference local_2e0;
  undefined8 *local_2d0;
  Mat *local_2c8;
  Mat *local_2c0;
  NetPrivate **local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  void **local_290;
  Mat *local_288;
  Mat *local_280;
  void **local_278;
  void **local_268;
  NetPrivate **local_258;
  vector<int,_std::allocator<int>_> *local_248;
  Mat *local_238;
  Mat *local_228;
  int local_210;
  undefined4 local_20c;
  Mat *local_208;
  int local_1f0;
  undefined4 local_1ec;
  vector<int,_std::allocator<int>_> *local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  NetPrivate **local_1c8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  Mat *local_178;
  int local_170;
  undefined4 local_16c;
  Mat *local_168;
  int local_160;
  undefined4 local_15c;
  Mat *local_158;
  int local_150;
  undefined4 local_14c;
  reference local_148;
  int local_140;
  undefined4 local_13c;
  NetPrivate *local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  int local_104;
  void **local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  NetPrivate **local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  Net *local_98;
  Mat *local_90;
  Option *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_50;
  NetPrivate *local_40;
  _func_int **local_30;
  undefined4 local_c;
  long local_8;
  
  local_33c = 0;
  local_338 = in_RSI;
  iVar4 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_33c);
  if (iVar4 == 1) {
    if (local_33c == 0x7685dd) {
      local_340 = 0;
      local_344 = 0;
      iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_340);
      if (iVar4 == 1) {
        iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_344);
        if (iVar4 == 1) {
          if ((local_340 < 1) || (local_344 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_324 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff420,
                       (size_type)in_stack_fffffffffffff418);
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff420);
            local_35c = 0;
            for (local_360 = 0; (int)local_360 < local_340; local_360 = local_360 + 1) {
              local_56c = 0;
              local_570 = 0;
              iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_468);
              if (iVar4 != 1) {
                fprintf(_stderr,"parse layer_type failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_580 = 1;
                goto LAB_00170c79;
              }
              iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_568);
              if (iVar4 != 1) {
                fprintf(_stderr,"parse layer_name failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_580 = 1;
                goto LAB_00170c79;
              }
              iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_56c);
              if (iVar4 != 1) {
                fprintf(_stderr,"parse bottom_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_580 = 1;
                goto LAB_00170c79;
              }
              iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%d",&local_570);
              if (iVar4 != 1) {
                fprintf(_stderr,"parse top_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_580 = 1;
                goto LAB_00170c79;
              }
              local_588 = (NetPrivate *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_468);
              if (local_588 == (NetPrivate *)0x0) {
                local_588 = (NetPrivate *)create_layer_cpu(in_stack_fffffffffffff3f8);
              }
              if (local_588 == (NetPrivate *)0x0) {
                local_588 = (NetPrivate *)(**(code **)(*in_RDI + 0x18))(in_RDI,local_468);
              }
              if (local_588 == (NetPrivate *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered",local_468);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff4b0);
                local_324 = -1;
                local_580 = 1;
                goto LAB_00170c79;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff440,(char *)in_stack_fffffffffffff438,
                         (allocator<char> *)in_stack_fffffffffffff430);
              std::__cxx11::string::operator=
                        ((string *)
                         &(local_588->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_5a8);
              std::__cxx11::string::~string(local_5a8);
              std::allocator<char>::~allocator(&local_5a9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff440,(char *)in_stack_fffffffffffff438,
                         (allocator<char> *)in_stack_fffffffffffff430);
              std::__cxx11::string::operator=((string *)&local_588->output_blob_indexes,local_5d0);
              std::__cxx11::string::~string(local_5d0);
              std::allocator<char>::~allocator(&local_5d1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff420,
                         (size_type)in_stack_fffffffffffff418);
              for (local_5d8 = 0; local_5d8 < local_56c; local_5d8 = local_5d8 + 1) {
                iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_6d8);
                if (iVar4 != 1) {
                  fprintf(_stderr,"parse bottom_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  local_580 = 1;
                  goto LAB_00170c79;
                }
                local_6dc = find_blob_index_by_name
                                      ((Net *)in_stack_fffffffffffff418,
                                       (char *)in_stack_fffffffffffff410);
                if (local_6dc == -1) {
                  local_6e8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI[9] + 8),(long)local_35c);
                  local_6dc = local_35c;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff440,(char *)in_stack_fffffffffffff438,
                             (allocator<char> *)in_stack_fffffffffffff430);
                  std::__cxx11::string::operator=((string *)local_6e8,local_708);
                  std::__cxx11::string::~string(local_708);
                  std::allocator<char>::~allocator(&local_709);
                  local_35c = local_35c + 1;
                }
                local_718 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_6dc);
                iVar4 = local_6dc;
                local_718->consumer = local_360;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &(local_588->input_blob_names).
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(long)local_5d8);
                *pvVar5 = iVar4;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff420,
                         (size_type)in_stack_fffffffffffff418);
              for (local_71c = 0; local_71c < local_570; local_71c = local_71c + 1) {
                local_728 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_35c);
                iVar4 = (**(code **)(*local_338 + 0x10))(local_338,"%255s",local_828);
                if (iVar4 != 1) {
                  fprintf(_stderr,"parse blob_name failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  local_580 = 1;
                  goto LAB_00170c79;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff440,(char *)in_stack_fffffffffffff438,
                           (allocator<char> *)in_stack_fffffffffffff430);
                std::__cxx11::string::operator=((string *)local_728,local_848);
                std::__cxx11::string::~string(local_848);
                std::allocator<char>::~allocator(&local_849);
                iVar4 = local_35c;
                local_728->producer = local_360;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &(local_588->output_blob_names).
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(long)local_71c);
                *pvVar5 = iVar4;
                local_35c = local_35c + 1;
              }
              local_850 = *(bool *)((long)&(local_588->blobs).
                                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2) & 1;
              local_854 = ParamDict::load_param(in_stack_fffffffffffff728,in_stack_fffffffffffff720)
              ;
              if (local_854 == 0) {
                local_320 = &local_8e8;
                local_8e8 = (void *)0x0;
                piVar12 = (int *)0x0;
                ParamDict::get(&local_8a0,&local_358,0x1e,(Mat *)&local_8e8);
                local_278 = &local_8e8;
                local_188 = local_278;
                if (piVar12 != (int *)0x0) {
                  local_18c = 0xffffffff;
                  LOCK();
                  local_190 = *piVar12;
                  *piVar12 = *piVar12 + -1;
                  UNLOCK();
                  if ((local_190 == 1) && (local_60 = local_8e8, local_8e8 != (void *)0x0)) {
                    free(local_8e8);
                  }
                }
                local_8e8 = (void *)0x0;
                in_stack_fffffffffffff728 = (ParamDict *)0x0;
                in_stack_fffffffffffff720 = (DataReader *)0x0;
                local_228 = &local_8a0;
                if ((int *)local_8a0.data != (int *)0x0) {
                  local_90 = local_228;
                }
                if ((int *)local_8a0.data != (int *)0x0 && local_8a0.cstep * (long)local_8a0.c != 0)
                {
                  local_130 = &local_8a0;
                  local_8f0 = (int *)local_8a0.data;
                  for (local_8f4 = 0; local_8f4 < local_570; local_8f4 = local_8f4 + 1) {
                    lVar1 = in_RDI[9];
                    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)
                                        &(local_588->output_blob_names).
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_8f4)
                    ;
                    pvVar6 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        (lVar1 + 8),(long)*pvVar5);
                    local_904 = *local_8f0;
                    local_900 = pvVar6;
                    if (local_904 == 1) {
                      local_104 = local_8f0[1];
                      local_100 = &local_950;
                      local_110 = 0;
                      local_118 = 4;
                      local_11c = 1;
                      local_128 = 0;
                      local_950 = (void *)0x0;
                      local_948 = (int *)0x0;
                      local_940 = 4;
                      local_938 = 1;
                      local_930 = (long *)0x0;
                      local_928 = 1;
                      local_924 = local_104;
                      local_920 = 1;
                      local_91c = 1;
                      local_918 = 1;
                      local_910 = (long)local_104;
                      pMVar7 = &pvVar6->shape;
                      local_290 = &local_950;
                      local_288 = pMVar7;
                      if (pMVar7 != (Mat *)local_290) {
                        local_178 = pMVar7;
                        if ((pvVar6->shape).refcount != (int *)0x0) {
                          piVar12 = (pvVar6->shape).refcount;
                          local_17c = 0xffffffff;
                          LOCK();
                          local_180 = *piVar12;
                          *piVar12 = *piVar12 + -1;
                          UNLOCK();
                          if (local_180 == 1) {
                            if ((pvVar6->shape).allocator == (Allocator *)0x0) {
                              local_68 = pMVar7->data;
                              if (local_68 != (void *)0x0) {
                                free(local_68);
                              }
                            }
                            else {
                              pAVar2 = (pvVar6->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar7->data);
                            }
                          }
                        }
                        pMVar7->data = (void *)0x0;
                        (pvVar6->shape).elemsize = 0;
                        (pvVar6->shape).elempack = 0;
                        (pvVar6->shape).dims = 0;
                        (pvVar6->shape).w = 0;
                        (pvVar6->shape).h = 0;
                        (pvVar6->shape).d = 0;
                        (pvVar6->shape).c = 0;
                        (pvVar6->shape).cstep = 0;
                        (pvVar6->shape).refcount = (int *)0x0;
                        pMVar7->data = *local_290;
                        (pvVar6->shape).refcount = (int *)local_290[1];
                        (pvVar6->shape).elemsize = (size_t)local_290[2];
                        (pvVar6->shape).elempack = *(int *)(local_290 + 3);
                        (pvVar6->shape).allocator = (Allocator *)local_290[4];
                        (pvVar6->shape).dims = *(int *)(local_290 + 5);
                        (pvVar6->shape).w = *(int *)((long)local_290 + 0x2c);
                        (pvVar6->shape).h = *(int *)(local_290 + 6);
                        (pvVar6->shape).d = *(int *)((long)local_290 + 0x34);
                        (pvVar6->shape).c = *(int *)(local_290 + 7);
                        (pvVar6->shape).cstep = (size_t)local_290[8];
                      }
                      local_268 = &local_950;
                      local_280 = pMVar7;
                      local_1a8 = local_268;
                      if (local_948 != (int *)0x0) {
                        local_1ac = 0xffffffff;
                        LOCK();
                        local_1b0 = *local_948;
                        *local_948 = *local_948 + -1;
                        UNLOCK();
                        if (local_1b0 == 1) {
                          if (local_930 == (long *)0x0) {
                            local_50 = local_950;
                            if (local_950 != (void *)0x0) {
                              free(local_950);
                            }
                          }
                          else {
                            (**(code **)(*local_930 + 0x18))(local_930,local_950);
                          }
                        }
                      }
                      local_950 = (void *)0x0;
                      local_940 = 0;
                      local_938 = 0;
                      local_928 = 0;
                      local_924 = 0;
                      local_920 = 0;
                      local_91c = 0;
                      local_918 = 0;
                      local_910 = 0;
                      local_948 = (int *)0x0;
                    }
                    pvVar6 = local_900;
                    if (local_904 == 2) {
                      local_d4 = local_8f0[1];
                      local_d8 = local_8f0[2];
                      local_d0 = &local_998;
                      local_e0 = 0;
                      local_e8 = 4;
                      local_ec = 1;
                      local_f8 = 0;
                      local_998 = (NetPrivate *)0x0;
                      local_990 = (int *)0x0;
                      local_988 = 4;
                      local_980 = 1;
                      local_978 = (long *)0x0;
                      local_970 = 2;
                      local_96c = local_d4;
                      local_968 = local_d8;
                      local_964 = 1;
                      local_960 = 1;
                      local_958 = (long)local_d4 * (long)local_d8;
                      pMVar7 = &local_900->shape;
                      local_2b0 = &local_998;
                      local_2a8 = pMVar7;
                      if (pMVar7 != (Mat *)local_2b0) {
                        local_168 = pMVar7;
                        if ((local_900->shape).refcount != (int *)0x0) {
                          piVar12 = (local_900->shape).refcount;
                          local_16c = 0xffffffff;
                          LOCK();
                          local_170 = *piVar12;
                          *piVar12 = *piVar12 + -1;
                          UNLOCK();
                          if (local_170 == 1) {
                            if ((local_900->shape).allocator == (Allocator *)0x0) {
                              local_70 = pMVar7->data;
                              if (local_70 != (void *)0x0) {
                                free(local_70);
                              }
                            }
                            else {
                              pAVar2 = (local_900->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar7->data);
                            }
                          }
                        }
                        pMVar7->data = (void *)0x0;
                        (pvVar6->shape).elemsize = 0;
                        (pvVar6->shape).elempack = 0;
                        (pvVar6->shape).dims = 0;
                        (pvVar6->shape).w = 0;
                        (pvVar6->shape).h = 0;
                        (pvVar6->shape).d = 0;
                        (pvVar6->shape).c = 0;
                        (pvVar6->shape).cstep = 0;
                        (pvVar6->shape).refcount = (int *)0x0;
                        pMVar7->data = *local_2b0;
                        (pvVar6->shape).refcount = (int *)local_2b0[1];
                        (pvVar6->shape).elemsize = (size_t)local_2b0[2];
                        (pvVar6->shape).elempack = *(int *)(local_2b0 + 3);
                        (pvVar6->shape).allocator = (Allocator *)local_2b0[4];
                        (pvVar6->shape).dims = *(int *)(local_2b0 + 5);
                        (pvVar6->shape).w = *(int *)((long)local_2b0 + 0x2c);
                        (pvVar6->shape).h = *(int *)(local_2b0 + 6);
                        (pvVar6->shape).d = *(int *)((long)local_2b0 + 0x34);
                        (pvVar6->shape).c = *(int *)(local_2b0 + 7);
                        (pvVar6->shape).cstep = (size_t)local_2b0[8];
                      }
                      local_258 = &local_998;
                      local_2a0 = pMVar7;
                      local_1c8 = local_258;
                      if (local_990 != (int *)0x0) {
                        local_1cc = 0xffffffff;
                        LOCK();
                        local_1d0 = *local_990;
                        *local_990 = *local_990 + -1;
                        UNLOCK();
                        if (local_1d0 == 1) {
                          if (local_978 == (long *)0x0) {
                            local_40 = local_998;
                            if (local_998 != (NetPrivate *)0x0) {
                              free(local_998);
                            }
                          }
                          else {
                            (**(code **)(*local_978 + 0x18))(local_978,local_998);
                          }
                        }
                      }
                      local_998 = (NetPrivate *)0x0;
                      local_988 = 0;
                      local_980 = 0;
                      local_970 = 0;
                      local_96c = 0;
                      local_968 = 0;
                      local_964 = 0;
                      local_960 = 0;
                      local_958 = 0;
                      local_990 = (int *)0x0;
                    }
                    pvVar6 = local_900;
                    if (local_904 == 3) {
                      local_9c = local_8f0[1];
                      local_a0 = local_8f0[2];
                      local_a4 = local_8f0[3];
                      in_stack_fffffffffffff4b0 = (Net *)local_9e0;
                      local_b0 = 0;
                      local_b8 = 4;
                      local_bc = 1;
                      local_c8 = 0;
                      local_9e0 = (undefined1  [8])0x0;
                      local_9d8 = (int *)0x0;
                      local_9d0 = (Allocator *)0x4;
                      local_9c8 = 1;
                      local_9c0 = (long *)0x0;
                      local_9b8._0_1_ = true;
                      local_9b8._1_1_ = false;
                      local_9b8._2_1_ = false;
                      local_9b8._3_1_ = false;
                      local_9b4 = local_9c;
                      local_9b0 = local_a0;
                      local_9ac._0_1_ = true;
                      local_9ac._1_1_ = false;
                      local_9ac._2_1_ = false;
                      local_9ac._3_1_ = false;
                      local_9a8 = local_a4;
                      local_8 = (long)local_9c * (long)local_a0 * 4;
                      local_c = 0x10;
                      uVar8 = local_8 + 0xfU & 0xfffffffffffffff0;
                      local_9a0 = uVar8 / 4;
                      pMVar7 = &local_900->shape;
                      local_2d0 = (undefined8 *)local_9e0;
                      local_2c8 = pMVar7;
                      local_98 = in_stack_fffffffffffff4b0;
                      if (pMVar7 != (Mat *)local_2d0) {
                        in_stack_fffffffffffff4a0 = pMVar7;
                        local_158 = pMVar7;
                        if ((local_900->shape).refcount != (int *)0x0) {
                          piVar12 = (local_900->shape).refcount;
                          local_15c = 0xffffffff;
                          LOCK();
                          local_160 = *piVar12;
                          *piVar12 = *piVar12 + -1;
                          UNLOCK();
                          if (local_160 == 1) {
                            if ((local_900->shape).allocator == (Allocator *)0x0) {
                              local_78 = pMVar7->data;
                              if (local_78 != (void *)0x0) {
                                free(local_78);
                              }
                            }
                            else {
                              pAVar2 = (local_900->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar7->data,uVar8 % 4);
                            }
                          }
                        }
                        in_stack_fffffffffffff4a0->data = (void *)0x0;
                        in_stack_fffffffffffff4a0->elemsize = 0;
                        in_stack_fffffffffffff4a0->elempack = 0;
                        in_stack_fffffffffffff4a0->dims = 0;
                        in_stack_fffffffffffff4a0->w = 0;
                        in_stack_fffffffffffff4a0->h = 0;
                        in_stack_fffffffffffff4a0->d = 0;
                        in_stack_fffffffffffff4a0->c = 0;
                        in_stack_fffffffffffff4a0->cstep = 0;
                        in_stack_fffffffffffff4a0->refcount = (int *)0x0;
                        pMVar7->data = (void *)*local_2d0;
                        (pvVar6->shape).refcount = (int *)local_2d0[1];
                        (pvVar6->shape).elemsize = local_2d0[2];
                        (pvVar6->shape).elempack = *(int *)(local_2d0 + 3);
                        (pvVar6->shape).allocator = (Allocator *)local_2d0[4];
                        (pvVar6->shape).dims = *(int *)(local_2d0 + 5);
                        (pvVar6->shape).w = *(int *)((long)local_2d0 + 0x2c);
                        (pvVar6->shape).h = *(int *)(local_2d0 + 6);
                        (pvVar6->shape).d = *(int *)((long)local_2d0 + 0x34);
                        (pvVar6->shape).c = *(int *)(local_2d0 + 7);
                        (pvVar6->shape).cstep = local_2d0[8];
                      }
                      in_stack_fffffffffffff498 = (vector<int,_std::allocator<int>_> *)local_9e0;
                      local_2c0 = pMVar7;
                      local_248 = in_stack_fffffffffffff498;
                      local_1e8 = in_stack_fffffffffffff498;
                      if (local_9d8 != (int *)0x0) {
                        local_1ec = 0xffffffff;
                        LOCK();
                        local_1f0 = *local_9d8;
                        *local_9d8 = *local_9d8 + -1;
                        UNLOCK();
                        if (local_1f0 == 1) {
                          if (local_9c0 == (long *)0x0) {
                            local_30 = (_func_int **)local_9e0;
                            if (local_9e0 != (undefined1  [8])0x0) {
                              free((void *)local_9e0);
                            }
                          }
                          else {
                            (**(code **)(*local_9c0 + 0x18))(local_9c0,local_9e0);
                          }
                        }
                      }
                      (in_stack_fffffffffffff498->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      (in_stack_fffffffffffff498->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      *(undefined4 *)
                       &in_stack_fffffffffffff498[1].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start = 0;
                      *(undefined4 *)
                       &in_stack_fffffffffffff498[1].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
                      *(undefined4 *)
                       ((long)&in_stack_fffffffffffff498[1].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 4) = 0;
                      *(undefined4 *)
                       &in_stack_fffffffffffff498[2].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start = 0;
                      *(undefined4 *)
                       ((long)&in_stack_fffffffffffff498[2].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 4) = 0;
                      *(undefined4 *)
                       &in_stack_fffffffffffff498[2].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = 0;
                      in_stack_fffffffffffff498[2].super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      (in_stack_fffffffffffff498->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    }
                    local_8f0 = local_8f0 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
                for (local_9e4 = 0; local_9e4 < local_56c; local_9e4 = local_9e4 + 1) {
                  lVar1 = in_RDI[9];
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      &(local_588->input_blob_names).
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_9e4);
                  pvVar6 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(lVar1 + 8)
                                      ,(long)*pvVar5);
                  pMVar7 = &pvVar6->shape;
                  pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                      &(local_588->custom_layer_registry).
                                       super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_9e4);
                  local_2f0 = pMVar7;
                  local_2e8 = pvVar9;
                  if (pvVar9 != pMVar7) {
                    if ((pvVar6->shape).refcount != (int *)0x0) {
                      piVar12 = (pvVar6->shape).refcount;
                      local_2f4 = 1;
                      LOCK();
                      local_2f8 = *piVar12;
                      *piVar12 = *piVar12 + 1;
                      UNLOCK();
                    }
                    local_148 = pvVar9;
                    if (pvVar9->refcount != (int *)0x0) {
                      piVar12 = pvVar9->refcount;
                      local_14c = 0xffffffff;
                      LOCK();
                      local_150 = *piVar12;
                      *piVar12 = *piVar12 + -1;
                      UNLOCK();
                      if (local_150 == 1) {
                        if (pvVar9->allocator == (Allocator *)0x0) {
                          local_80 = pvVar9->data;
                          if (local_80 != (void *)0x0) {
                            free(local_80);
                          }
                        }
                        else {
                          (*pvVar9->allocator->_vptr_Allocator[3])(pvVar9->allocator,pvVar9->data);
                        }
                      }
                    }
                    pvVar9->data = (void *)0x0;
                    pvVar9->elemsize = 0;
                    pvVar9->elempack = 0;
                    pvVar9->dims = 0;
                    pvVar9->w = 0;
                    pvVar9->h = 0;
                    pvVar9->d = 0;
                    pvVar9->c = 0;
                    pvVar9->cstep = 0;
                    pvVar9->refcount = (int *)0x0;
                    pvVar9->data = local_2f0->data;
                    pvVar9->refcount = local_2f0->refcount;
                    pvVar9->elemsize = local_2f0->elemsize;
                    pvVar9->elempack = local_2f0->elempack;
                    pvVar9->allocator = local_2f0->allocator;
                    pvVar9->dims = local_2f0->dims;
                    pvVar9->w = local_2f0->w;
                    pvVar9->h = local_2f0->h;
                    pvVar9->d = local_2f0->d;
                    pvVar9->c = local_2f0->c;
                    pvVar9->cstep = local_2f0->cstep;
                  }
                  local_2e0 = pvVar9;
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
                for (local_9e8 = 0; local_9e8 < local_570; local_9e8 = local_9e8 + 1) {
                  lVar1 = in_RDI[9];
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      &(local_588->output_blob_names).
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_9e8);
                  pvVar6 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(lVar1 + 8)
                                      ,(long)*pvVar5);
                  pMVar7 = &pvVar6->shape;
                  pNVar10 = (NetPrivate *)
                            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                       &(local_588->overwrite_builtin_layer_registry).
                                        super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,(long)local_9e8);
                  local_310 = pMVar7;
                  local_308 = pNVar10;
                  if (pNVar10 != (NetPrivate *)pMVar7) {
                    if ((pvVar6->shape).refcount != (int *)0x0) {
                      piVar12 = (pvVar6->shape).refcount;
                      local_314 = 1;
                      LOCK();
                      local_318 = *piVar12;
                      *piVar12 = *piVar12 + 1;
                      UNLOCK();
                    }
                    in_stack_fffffffffffff450 = pNVar10;
                    local_138 = pNVar10;
                    if ((pNVar10->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      pBVar3 = (pNVar10->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_13c = 0xffffffff;
                      LOCK();
                      local_140 = *(int *)&pBVar3->name;
                      *(int *)&pBVar3->name = *(int *)&pBVar3->name + -1;
                      UNLOCK();
                      if (local_140 == 1) {
                        if ((Allocator *)
                            (pNVar10->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start == (Allocator *)0x0) {
                          local_88 = pNVar10->opt;
                          if (local_88 != (Option *)0x0) {
                            free(local_88);
                          }
                        }
                        else {
                          pAVar2 = (Allocator *)
                                   (pNVar10->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          (*pAVar2->_vptr_Allocator[3])(pAVar2,pNVar10->opt);
                        }
                      }
                    }
                    in_stack_fffffffffffff450->opt = (Option *)0x0;
                    (in_stack_fffffffffffff450->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    *(int *)&(in_stack_fffffffffffff450->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)&(in_stack_fffffffffffff450->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish = 0;
                    *(int *)((long)&(in_stack_fffffffffffff450->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff450->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
                    *(int *)((long)&(in_stack_fffffffffffff450->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
                    *(int *)&(in_stack_fffffffffffff450->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start = 0;
                    (in_stack_fffffffffffff450->input_blob_indexes).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish = (pointer)0x0;
                    (in_stack_fffffffffffff450->blobs).
                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    pNVar10->opt = (Option *)local_310->data;
                    (pNVar10->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)local_310->refcount;
                    (pNVar10->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_310->elemsize;
                    *(int *)&(pNVar10->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage = local_310->elempack;
                    (pNVar10->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)local_310->allocator;
                    *(int *)&(pNVar10->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish = local_310->dims;
                    *(int *)((long)&(pNVar10->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) = local_310->w;
                    *(int *)&(pNVar10->layers).
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage = local_310->h;
                    *(int *)((long)&(pNVar10->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                         local_310->d;
                    *(int *)&(pNVar10->input_blob_indexes).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start = local_310->c;
                    (pNVar10->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_310->cstep;
                  }
                  local_300 = pNVar10;
                }
                iVar4 = ParamDict::get(&local_358,0x1f,0);
                *(int *)((long)&(local_588->blobs).
                                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4) = iVar4;
                iVar4 = (*(code *)local_588->opt->workspace_allocator)(local_588,&local_358);
                if (iVar4 == 0) {
                  if (((ulong)(local_588->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_start & 0x1000000000000) != 0) {
                    *(undefined1 *)((long)in_RDI + 0x27) = 0;
                  }
                  get_masked_option((Option *)in_stack_fffffffffffff420,
                                    (int)((ulong)in_stack_fffffffffffff418 >> 0x20));
                  if ((local_850 == 0) ||
                     ((((ulong)(local_588->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x10000) != 0 &&
                      ((local_a11 & 1) != 0)))) {
LAB_001709a5:
                    in_stack_fffffffffffff418 = local_588;
                    ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::
                               operator[]((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                          (in_RDI[9] + 0x20),(long)(int)local_360);
                    *ppLVar11 = (value_type)in_stack_fffffffffffff418;
                    local_580 = 0;
                  }
                  else {
                    in_stack_fffffffffffff440 =
                         (NetPrivate *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_468);
                    local_a38 = in_stack_fffffffffffff440;
                    if (in_stack_fffffffffffff440 == (NetPrivate *)0x0) {
                      in_stack_fffffffffffff438 =
                           (NetPrivate *)create_layer_cpu(in_stack_fffffffffffff3f8);
                      local_a38 = in_stack_fffffffffffff438;
                    }
                    if (local_a38 == (NetPrivate *)0x0) {
                      in_stack_fffffffffffff430 =
                           (NetPrivate *)(**(code **)(*in_RDI + 0x18))(in_RDI,local_468);
                      local_a38 = in_stack_fffffffffffff430;
                    }
                    if (local_a38 == (NetPrivate *)0x0) {
                      fprintf(_stderr,"layer %s not exists or registered",local_468);
                      fprintf(_stderr,"\n");
                      clear(in_stack_fffffffffffff4b0);
                      local_324 = -1;
                      local_580 = 1;
                    }
                    else {
                      std::__cxx11::string::operator=
                                ((string *)
                                 &(local_a38->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (string *)
                                 &(local_588->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::__cxx11::string::operator=
                                ((string *)&local_a38->output_blob_indexes,
                                 (string *)&local_588->output_blob_indexes);
                      std::vector<int,_std::allocator<int>_>::operator=
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4a0,
                                 in_stack_fffffffffffff498);
                      std::vector<int,_std::allocator<int>_>::operator=
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff4a0,
                                 in_stack_fffffffffffff498);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff4a0,
                                 (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff498);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff4a0,
                                 (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff498);
                      *(int *)((long)&(local_a38->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                           *(int *)((long)&(local_588->blobs).
                                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                      iVar4 = (*(code *)local_a38->opt->workspace_allocator)(local_a38,&local_358);
                      if (iVar4 == 0) {
                        in_stack_fffffffffffff420 = local_588;
                        if (local_588 != (NetPrivate *)0x0) {
                          (*(code *)local_588->opt->blob_allocator)();
                          in_stack_fffffffffffff420 = local_588;
                        }
                        local_588 = local_a38;
                        goto LAB_001709a5;
                      }
                      fprintf(_stderr,"layer load_param %d %s failed",(ulong)local_360,local_568);
                      fprintf(_stderr,"\n");
                      local_580 = 0xe;
                    }
                  }
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",(ulong)local_360,local_568);
                  fprintf(_stderr,"\n");
                  local_580 = 0xe;
                }
                in_stack_fffffffffffff410 = &local_8a0;
                local_238 = in_stack_fffffffffffff410;
                local_208 = in_stack_fffffffffffff410;
                if (local_8a0.refcount != (int *)0x0) {
                  local_20c = 0xffffffff;
                  LOCK();
                  local_210 = *local_8a0.refcount;
                  *local_8a0.refcount = *local_8a0.refcount + -1;
                  UNLOCK();
                  if (local_210 == 1) {
                    if (local_8a0.allocator == (Allocator *)0x0) {
                      if ((int *)local_8a0.data != (int *)0x0) {
                        free(local_8a0.data);
                      }
                    }
                    else {
                      (*(local_8a0.allocator)->_vptr_Allocator[3])
                                (local_8a0.allocator,local_8a0.data);
                    }
                  }
                }
                in_stack_fffffffffffff410->data = (void *)0x0;
                in_stack_fffffffffffff410->elemsize = 0;
                in_stack_fffffffffffff410->elempack = 0;
                in_stack_fffffffffffff410->dims = 0;
                in_stack_fffffffffffff410->w = 0;
                in_stack_fffffffffffff410->h = 0;
                in_stack_fffffffffffff410->d = 0;
                in_stack_fffffffffffff410->c = 0;
                in_stack_fffffffffffff410->cstep = 0;
                in_stack_fffffffffffff410->refcount = (int *)0x0;
                if ((local_580 != 0) && (local_580 != 0xe)) goto LAB_00170c79;
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",(ulong)local_360,local_568);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff430);
            NetPrivate::update_input_output_names(in_stack_fffffffffffff450);
            local_324 = 0;
            local_580 = 1;
LAB_00170c79:
            ParamDict::~ParamDict(in_stack_fffffffffffff400);
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed");
          fprintf(_stderr,"\n");
          local_324 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed");
        fprintf(_stderr,"\n");
        local_324 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_324 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed");
    fprintf(_stderr,"\n");
    local_324 = -1;
  }
  return local_324;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(layer_type);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer_name);
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(layer_type);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(layer_type);
            }
            if (!layer_cpu)
            {
                layer_cpu = create_custom_layer(layer_type);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %s not exists or registered", layer_type);
                clear();
                return -1;
            }

            layer_cpu->type = layer->type;
            layer_cpu->name = layer->name;
            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d %s failed", i, layer_name);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}